

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ParseMountInfo(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                *subsystems)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  bool bVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  string line;
  string newPath;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  string opt;
  MountPoint mp;
  ifstream mountinfo;
  byte abStack_218 [488];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(&mountinfo,"/proc/self/mountinfo",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while ((abStack_218[*(long *)(_mountinfo + -0x18)] & 2) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&mountinfo,(string *)&line);
      memset(&mp.deviceId,0,0x98);
      bVar3 = MountPoint::parse(&mp,&line);
      if (bVar3) {
        local_338.first._M_dataplus._M_p = "cgroup";
        local_338.first._M_string_length = 6;
        bVar3 = StringPiece::operator!=(&mp.fsType,(StringPiece *)&local_338);
        if (!bVar3) {
          lVar5 = 0;
          for (uVar6 = 0;
              uVar6 < (ulong)((long)mp.superOptions.
                                    super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)mp.superOptions.
                                    super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 4);
              uVar6 = uVar6 + 1) {
            StringPiece::AsString_abi_cxx11_
                      (&opt,(StringPiece *)
                            ((long)&(mp.superOptions.
                                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->str_ + lVar5));
            iVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                    ::find(&subsystems->_M_t,&opt);
            if ((_Rb_tree_header *)iVar4._M_node !=
                &(subsystems->_M_t)._M_impl.super__Rb_tree_header) {
              MountPoint::translate(&newPath,&mp,(string *)&iVar4._M_node[2]._M_parent);
              if (newPath._M_string_length != 0) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_338,&opt,&newPath);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)__return_storage_ptr__,&local_338);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_338);
              }
              std::__cxx11::string::~string((string *)&newPath);
            }
            std::__cxx11::string::~string((string *)&opt);
            lVar5 = lVar5 + 0x10;
          }
        }
      }
      MountPoint::~MountPoint(&mp);
      std::__cxx11::string::~string((string *)&line);
    }
  }
  std::ifstream::~ifstream(&mountinfo);
  return __return_storage_ptr__;
}

Assistant:

map<string, string> ParseMountInfo(map<string, CGroupSubSys>& subsystems) {
  map<string, string> cgroups;
  ifstream mountinfo("/proc/self/mountinfo");
  if (!mountinfo.is_open())
    return cgroups;
  while (!mountinfo.eof()) {
    string line;
    getline(mountinfo, line);
    MountPoint mp;
    if (!mp.parse(line))
      continue;
    if (mp.fsType != "cgroup")
      continue;
    for (size_t i = 0; i < mp.superOptions.size(); i++) {
      string opt = mp.superOptions[i].AsString();
      map<string, CGroupSubSys>::iterator subsys = subsystems.find(opt);
      if (subsys == subsystems.end())
        continue;
      string newPath = mp.translate(subsys->second.name);
      if (!newPath.empty())
        cgroups.insert(make_pair(opt, newPath));
    }
  }
  return cgroups;
}